

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *p,Aig_Obj_t *pOut,Aig_Obj_t *pIn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (((ulong)pOut & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x366,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pIn & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pIn)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x367,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pOut->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x368,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pIn->field_0x18 & 7) == 2) {
    iVar1 = p->nWordsFrame;
    iVar2 = p->nWordsTotal;
    if (iVar1 < iVar2) {
      if (0 < p->nWordsFrame) {
        iVar3 = pOut->Id;
        iVar4 = p->nFrames;
        iVar5 = pIn->Id;
        lVar6 = 0;
        do {
          *(undefined4 *)((long)&p[1].pAig + lVar6 * 4 + (long)(iVar2 * iVar5) * 4) =
               *(undefined4 *)
                ((long)&p[1].pAig +
                lVar6 * 4 + (long)((iVar4 + -1) * iVar1) * 4 + (long)(iVar3 * iVar2) * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nWordsFrame);
      }
      return;
    }
    __assert_fail("p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x36a,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  __assert_fail("Aig_ObjIsCi(pIn)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x369,"void Ssw_SmlNodeTransferFirst(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_SmlNodeTransferFirst( Ssw_Sml_t * p, Aig_Obj_t * pOut, Aig_Obj_t * pIn )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( !Aig_IsComplement(pOut) );
    assert( !Aig_IsComplement(pIn) );
    assert( Aig_ObjIsCo(pOut) );
    assert( Aig_ObjIsCi(pIn) );
    assert( p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0 = Ssw_ObjSim(p, pOut->Id) + p->nWordsFrame * (p->nFrames-1);
    pSims1 = Ssw_ObjSim(p, pIn->Id);
    // copy information as it is
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims1[i] = pSims0[i];
}